

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void nlohmann::json_abi_v3_11_3::detail::dtoa_impl::grisu2_round
               (char *buf,int len,uint64_t dist,uint64_t delta,uint64_t rest,uint64_t ten_k)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  if (len < 1) {
    __assert_fail("len >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/src/lib/include/libKriging/utils/nlohmann/json.hpp"
                  ,0x4430,
                  "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                 );
  }
  if (delta < dist) {
    __assert_fail("dist <= delta",
                  "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/src/lib/include/libKriging/utils/nlohmann/json.hpp"
                  ,0x4431,
                  "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                 );
  }
  uVar1 = delta - rest;
  if (delta < rest) {
    __assert_fail("rest <= delta",
                  "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/src/lib/include/libKriging/utils/nlohmann/json.hpp"
                  ,0x4432,
                  "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                 );
  }
  if (ten_k != 0) {
    uVar2 = dist - rest;
    for (; ((rest < dist && (bVar3 = ten_k <= uVar1, uVar1 = uVar1 - ten_k, bVar3)) &&
           ((rest + ten_k < dist || (rest + (ten_k - dist) < uVar2)))); uVar2 = uVar2 - ten_k) {
      if (buf[(ulong)(uint)len - 1] == '0') {
        __assert_fail("buf[len - 1] != \'0\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/src/lib/include/libKriging/utils/nlohmann/json.hpp"
                      ,0x444c,
                      "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                     );
      }
      buf[(ulong)(uint)len - 1] = buf[(ulong)(uint)len - 1] + -1;
      rest = rest + ten_k;
    }
    return;
  }
  __assert_fail("ten_k > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/src/lib/include/libKriging/utils/nlohmann/json.hpp"
                ,0x4433,
                "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
               );
}

Assistant:

inline void grisu2_round(char* buf, int len, std::uint64_t dist, std::uint64_t delta,
std::uint64_t rest, std::uint64_t ten_k)
{
JSON_ASSERT(len >= 1);
JSON_ASSERT(dist <= delta);
JSON_ASSERT(rest <= delta);
JSON_ASSERT(ten_k > 0);

//               <--------------------------- delta ---->
//                                  <---- dist --------->
// --------------[------------------+-------------------]--------------
//               M-                 w                   M+
//
//                                  ten_k
//                                <------>
//                                       <---- rest ---->
// --------------[------------------+----+--------------]--------------
//                                  w    V
//                                       = buf * 10^k
//
// ten_k represents a unit-in-the-last-place in the decimal representation
// stored in buf.
// Decrement buf by ten_k while this takes buf closer to w.

// The tests are written in this order to avoid overflow in unsigned
// integer arithmetic.

while (rest < dist
&& delta - rest >= ten_k
&& (rest + ten_k < dist || dist - rest > rest + ten_k - dist))
{
JSON_ASSERT(buf[len - 1] != '0');
buf[len - 1]--;
rest += ten_k;
}
}